

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glEffectCommitChanges(MOJOSHADER_glEffect *glEffect)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  int selector_ran;
  int shader_object;
  float selector;
  MOJOSHADER_effectValue *param;
  int j;
  int i;
  MOJOSHADER_effectShader *rawFrag;
  MOJOSHADER_effectShader *rawVert;
  MOJOSHADER_glEffect *glEffect_local;
  
  rawFrag = glEffect->current_vert_raw;
  _j = glEffect->current_frag_raw;
  bVar3 = false;
  rawVert = (MOJOSHADER_effectShader *)glEffect;
  if ((rawFrag != (MOJOSHADER_effectShader *)0x0) && (rawFrag->is_preshader != 0)) {
    param._4_4_ = 0;
    do {
      _shader_object =
           *(long *)(*(long *)rawVert + 0x20) +
           (ulong)rawFrag->preshader_params[(int)param._4_4_] * 0x50;
      for (param._0_4_ = 0; (uint)param < *(uint *)(_shader_object + 0x30) >> 2;
          param._0_4_ = (uint)param + 1) {
        memcpy(((rawFrag->field_10).shader)->mainfn +
               (long)(int)(uint)param * 4 +
               (ulong)*(uint *)(((rawFrag->field_10).shader)->output +
                               (long)(int)param._4_4_ * 0x38 + 0xc) * 4,
               (void *)(*(long *)(_shader_object + 0x38) + (long)(int)((uint)param << 2) * 4),
               (ulong)(uint)(*(int *)(_shader_object + 0x1c) << 2));
      }
      param._4_4_ = param._4_4_ + 1;
    } while (param._4_4_ < ((rawFrag->field_10).preshader)->symbol_count);
    MOJOSHADER_runPreshader((rawFrag->field_10).preshader,(float *)&selector_ran);
    uVar1 = *(uint *)(*(long *)(*(long *)(*(long *)rawVert + 0x20) + (ulong)*rawFrag->params * 0x50
                               + 0x38) + (long)(int)(float)selector_ran * 4);
    rawFrag = (MOJOSHADER_effectShader *)
              (*(long *)(*(long *)rawVert + 0x48) + (long)(int)uVar1 * 0x48);
    param._4_4_ = 0;
    do {
      if (uVar1 == rawVert->preshader_params[(int)param._4_4_]) {
        *(long *)&rawVert->sampler_count =
             *(long *)&rawVert->preshader_param_count + (long)(int)param._4_4_ * 0x10;
        break;
      }
      param._4_4_ = param._4_4_ + 1;
    } while (param._4_4_ < rawVert->pass);
    bVar3 = true;
  }
  if ((_j != (MOJOSHADER_effectShader *)0x0) && (_j->is_preshader != 0)) {
    param._4_4_ = 0;
    do {
      _shader_object =
           *(long *)(*(long *)rawVert + 0x20) + (ulong)_j->preshader_params[(int)param._4_4_] * 0x50
      ;
      for (param._0_4_ = 0; (uint)param < *(uint *)(_shader_object + 0x30) >> 2;
          param._0_4_ = (uint)param + 1) {
        memcpy(((_j->field_10).shader)->mainfn +
               (long)(int)(uint)param * 4 +
               (ulong)*(uint *)(((_j->field_10).shader)->output +
                               (long)(int)param._4_4_ * 0x38 + 0xc) * 4,
               (void *)(*(long *)(_shader_object + 0x38) + (long)(int)((uint)param << 2) * 4),
               (ulong)(uint)(*(int *)(_shader_object + 0x1c) << 2));
      }
      param._4_4_ = param._4_4_ + 1;
    } while (param._4_4_ < ((_j->field_10).preshader)->symbol_count);
    MOJOSHADER_runPreshader((_j->field_10).preshader,(float *)&selector_ran);
    uVar1 = *(uint *)(*(long *)(*(long *)(*(long *)rawVert + 0x20) + (ulong)*_j->params * 0x50 +
                               0x38) + (long)(int)(float)selector_ran * 4);
    _j = (MOJOSHADER_effectShader *)(*(long *)(*(long *)rawVert + 0x48) + (long)(int)uVar1 * 0x48);
    param._4_4_ = 0;
    do {
      if (uVar1 == rawVert->preshader_params[(int)param._4_4_]) {
        rawVert->samplers =
             (MOJOSHADER_samplerStateRegister *)
             (*(long *)&rawVert->preshader_param_count + (long)(int)param._4_4_ * 0x10);
        break;
      }
      param._4_4_ = param._4_4_ + 1;
    } while (param._4_4_ < rawVert->pass);
    bVar3 = true;
  }
  if (bVar3) {
    MOJOSHADER_glBindShaders
              (*(MOJOSHADER_glShader **)&rawVert->sampler_count,
               (MOJOSHADER_glShader *)rawVert->samplers);
    if ((rawVert->field_10).shader != (MOJOSHADER_parseData *)0x0) {
      *(MOJOSHADER_samplerStateRegister **)(*(long *)(*(long *)rawVert + 0x58) + 0x28) =
           rawFrag->samplers;
      *(uint *)(*(long *)(*(long *)rawVert + 0x58) + 0x20) = rawFrag->sampler_count;
    }
    lVar2._0_4_ = rawVert[1].type;
    lVar2._4_4_ = rawVert[1].technique;
    if (lVar2 != 0) {
      *(MOJOSHADER_samplerStateRegister **)(*(long *)(*(long *)rawVert + 0x58) + 0x18) =
           _j->samplers;
      *(uint *)(*(long *)(*(long *)rawVert + 0x58) + 0x10) = _j->sampler_count;
    }
  }
  if ((rawFrag != (MOJOSHADER_effectShader *)0x0) &&
     (copy_parameter_data(*(MOJOSHADER_effectParam **)(*(long *)rawVert + 0x20),rawFrag->params,
                          ((rawFrag->field_10).shader)->symbols,
                          ((rawFrag->field_10).shader)->symbol_count,ctx->vs_reg_file_f,
                          ctx->vs_reg_file_i,ctx->vs_reg_file_b),
     ((rawFrag->field_10).shader)->preshader != (MOJOSHADER_preshader *)0x0)) {
    copy_parameter_data(*(MOJOSHADER_effectParam **)(*(long *)rawVert + 0x20),
                        rawFrag->preshader_params,((rawFrag->field_10).shader)->preshader->symbols,
                        ((rawFrag->field_10).shader)->preshader->symbol_count,
                        ((rawFrag->field_10).shader)->preshader->registers,(GLint *)0x0,(uint8 *)0x0
                       );
    MOJOSHADER_runPreshader(((rawFrag->field_10).shader)->preshader,ctx->vs_reg_file_f);
  }
  if ((_j != (MOJOSHADER_effectShader *)0x0) &&
     (copy_parameter_data(*(MOJOSHADER_effectParam **)(*(long *)rawVert + 0x20),_j->params,
                          ((_j->field_10).shader)->symbols,((_j->field_10).shader)->symbol_count,
                          ctx->ps_reg_file_f,ctx->ps_reg_file_i,ctx->ps_reg_file_b),
     ((_j->field_10).shader)->preshader != (MOJOSHADER_preshader *)0x0)) {
    copy_parameter_data(*(MOJOSHADER_effectParam **)(*(long *)rawVert + 0x20),_j->preshader_params,
                        ((_j->field_10).shader)->preshader->symbols,
                        ((_j->field_10).shader)->preshader->symbol_count,
                        ((_j->field_10).shader)->preshader->registers,(GLint *)0x0,(uint8 *)0x0);
    MOJOSHADER_runPreshader(((_j->field_10).shader)->preshader,ctx->ps_reg_file_f);
  }
  ctx->generation = ctx->generation + 1;
  return;
}

Assistant:

void MOJOSHADER_glEffectCommitChanges(MOJOSHADER_glEffect *glEffect)
{
    MOJOSHADER_effectShader *rawVert = glEffect->current_vert_raw;
    MOJOSHADER_effectShader *rawFrag = glEffect->current_frag_raw;

    /* Used for shader selection from preshaders */
    int i, j;
    MOJOSHADER_effectValue *param;
    float selector;
    int shader_object;
    int selector_ran = 0;

    /* For effect passes with arrays of shaders, we have to run a preshader
     * that determines which shader to use, based on a parameter's value.
     * -flibit
     */
    // !!! FIXME: We're just running the preshaders every time. Blech. -flibit
    #define SELECT_SHADER_FROM_PRESHADER(raw, gls) \
        if (raw != NULL && raw->is_preshader) \
        { \
            i = 0; \
            do \
            { \
                param = &glEffect->effect->params[raw->preshader_params[i]].value; \
                for (j = 0; j < (param->value_count >> 2); j++) \
                    memcpy(raw->preshader->registers + raw->preshader->symbols[i].register_index + j, \
                           param->valuesI + (j << 2), \
                           param->type.columns << 2); \
            } while (++i < raw->preshader->symbol_count); \
            MOJOSHADER_runPreshader(raw->preshader, &selector); \
            shader_object = glEffect->effect->params[raw->params[0]].value.valuesI[(int) selector]; \
            raw = &glEffect->effect->objects[shader_object].shader; \
            i = 0; \
            do \
            { \
                if (shader_object == glEffect->shader_indices[i]) \
                { \
                    gls = &glEffect->shaders[i]; \
                    break; \
                } \
            } while (++i < glEffect->num_shaders); \
            selector_ran = 1; \
        }
    SELECT_SHADER_FROM_PRESHADER(rawVert, glEffect->current_vert)
    SELECT_SHADER_FROM_PRESHADER(rawFrag, glEffect->current_frag)
    #undef SELECT_SHADER_FROM_PRESHADER
    if (selector_ran)
    {
        MOJOSHADER_glBindShaders(glEffect->current_vert,
                                 glEffect->current_frag);
        if (glEffect->current_vert_raw != NULL)
        {
            glEffect->effect->state_changes->vertex_sampler_state_changes = rawVert->samplers;
            glEffect->effect->state_changes->vertex_sampler_state_change_count = rawVert->sampler_count;
        } // if
        if (glEffect->current_frag_raw != NULL)
        {
            glEffect->effect->state_changes->sampler_state_changes = rawFrag->samplers;
            glEffect->effect->state_changes->sampler_state_change_count = rawFrag->sampler_count;
        } // if
    } // if

    /* This is where parameters are copied into the constant buffers.
     * If you're looking for where things slow down immensely, look at
     * the copy_parameter_data() and MOJOSHADER_runPreshader() functions.
     * -flibit
     */
    // !!! FIXME: We're just copying everything every time. Blech. -flibit
    // !!! FIXME: We're just running the preshaders every time. Blech. -flibit
    // !!! FIXME: Will the preshader ever want int/bool registers? -flibit
    #define COPY_PARAMETER_DATA(raw, stage) \
        if (raw != NULL) \
        { \
            copy_parameter_data(glEffect->effect->params, raw->params, \
                                raw->shader->symbols, \
                                raw->shader->symbol_count, \
                                ctx->stage##_reg_file_f, \
                                ctx->stage##_reg_file_i, \
                                ctx->stage##_reg_file_b); \
            if (raw->shader->preshader) \
            { \
                copy_parameter_data(glEffect->effect->params, raw->preshader_params, \
                                    raw->shader->preshader->symbols, \
                                    raw->shader->preshader->symbol_count, \
                                    raw->shader->preshader->registers, \
                                    NULL, \
                                    NULL); \
                MOJOSHADER_runPreshader(raw->shader->preshader, ctx->stage##_reg_file_f); \
            } \
        }
    COPY_PARAMETER_DATA(rawVert, vs)
    COPY_PARAMETER_DATA(rawFrag, ps)
    #undef COPY_PARAMETER_DATA

    ctx->generation++;
}